

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O0

TIntermTyped * __thiscall
glslang::HlslParseContext::addConstructor
          (HlslParseContext *this,TSourceLoc *loc,TIntermTyped *node,TType *type)

{
  TType *pTVar1;
  TIntermNode *pTVar2;
  int iVar3;
  uint uVar4;
  TOperator TVar5;
  int iVar6;
  int iVar7;
  undefined4 extraout_var;
  vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_> *this_01;
  undefined4 extraout_var_00;
  reference pTVar8;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  ulong uVar9;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  reference ppTVar10;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  bool bVar11;
  TIntermTyped *constructor;
  __normal_iterator<TIntermNode_**,_std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>_>
  local_1b8;
  __normal_iterator<TIntermNode_**,_std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>_>
  local_1b0;
  iterator p;
  int paramCount;
  TIntermSequence *sequenceVector;
  HlslParseContext *local_190;
  TIntermTyped *newNode;
  undefined1 local_180 [7];
  bool singleArg;
  TType dereferenced;
  TType elementType;
  __normal_iterator<const_glslang::TTypeLoc_*,_std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>_>
  local_48;
  const_iterator memberTypes;
  TOperator op;
  TIntermAggregate *aggrNode;
  TType *type_local;
  TIntermTyped *node_local;
  TSourceLoc *loc_local;
  HlslParseContext *this_local;
  TIntermOperator *this_00;
  
  iVar3 = (*(node->super_TIntermNode)._vptr_TIntermNode[6])();
  this_00 = (TIntermOperator *)CONCAT44(extraout_var,iVar3);
  memberTypes._M_current._4_4_ =
       TIntermediate::mapTypeToConstructorOp
                 ((this->super_TParseContextBase).super_TParseVersions.intermediate,type);
  if (memberTypes._M_current._4_4_ == EOpConstructTextureSampler) {
    this_local = (HlslParseContext *)
                 TIntermediate::setAggregateOperator
                           ((this->super_TParseContextBase).super_TParseVersions.intermediate,
                            (TIntermNode *)this_00,EOpConstructTextureSampler,type,loc);
  }
  else {
    __gnu_cxx::
    __normal_iterator<const_glslang::TTypeLoc_*,_std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>_>
    ::__normal_iterator(&local_48);
    if (memberTypes._M_current._4_4_ == EOpConstructStruct) {
      this_01 = &TType::getStruct(type)->
                 super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>;
      local_48._M_current =
           (TTypeLoc *)
           std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>::begin
                     (this_01);
    }
    TType::TType((TType *)&dereferenced.spirvType,EbtVoid,EvqTemporary,1,0,0,false);
    uVar4 = (*type->_vptr_TType[0x1d])();
    if ((uVar4 & 1) == 0) {
      TType::shallowCopy((TType *)&dereferenced.spirvType,type);
    }
    else {
      TType::TType((TType *)local_180,type,0,false);
      TType::shallowCopy((TType *)&dereferenced.spirvType,(TType *)local_180);
      TType::~TType((TType *)local_180);
    }
    if (this_00 == (TIntermOperator *)0x0) {
      bVar11 = true;
    }
    else {
      TVar5 = TIntermOperator::getOp(this_00);
      bVar11 = TVar5 != EOpNull;
    }
    if (bVar11) {
      uVar4 = (*type->_vptr_TType[0x1d])();
      if (((uVar4 & 1) == 0) ||
         (uVar4 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x2a])(), (uVar4 & 1) == 0)) {
        uVar4 = (*type->_vptr_TType[0x1d])();
        if ((uVar4 & 1) == 0) {
          if (memberTypes._M_current._4_4_ == EOpConstructStruct) {
            pTVar8 = __gnu_cxx::
                     __normal_iterator<const_glslang::TTypeLoc_*,_std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>_>
                     ::operator*(&local_48);
            pTVar1 = pTVar8->type;
            iVar3 = (**(node->super_TIntermNode)._vptr_TIntermNode)();
            local_190 = (HlslParseContext *)
                        constructAggregate(this,&node->super_TIntermNode,pTVar1,1,
                                           (TSourceLoc *)CONCAT44(extraout_var_01,iVar3));
          }
          else {
            uVar4 = (*type->_vptr_TType[0x1c])();
            type_local = (TType *)node;
            if ((uVar4 & 1) != 0) {
              iVar3 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x1e])();
              uVar9 = (**(code **)(*(long *)CONCAT44(extraout_var_02,iVar3) + 200))();
              if ((uVar9 & 1) != 0) {
                type_local = (TType *)TIntermediate::addShapeConversion
                                                ((this->super_TParseContextBase).
                                                 super_TParseVersions.intermediate,type,node);
              }
            }
            TVar5 = memberTypes._M_current._4_4_;
            iVar3 = (**type_local->_vptr_TType)();
            local_190 = (HlslParseContext *)
                        constructBuiltIn(this,type,TVar5,(TIntermTyped *)type_local,
                                         (TSourceLoc *)CONCAT44(extraout_var_03,iVar3),false);
          }
        }
        else {
          iVar3 = (**(node->super_TIntermNode)._vptr_TIntermNode)();
          local_190 = (HlslParseContext *)
                      constructAggregate(this,&node->super_TIntermNode,
                                         (TType *)&dereferenced.spirvType,1,
                                         (TSourceLoc *)CONCAT44(extraout_var_00,iVar3));
        }
      }
      else {
        local_190 = (HlslParseContext *)convertArray(this,node,type);
      }
      if ((local_190 != (HlslParseContext *)0x0) &&
         ((uVar4 = (*type->_vptr_TType[0x1d])(), (uVar4 & 1) != 0 ||
          (memberTypes._M_current._4_4_ == EOpConstructStruct)))) {
        local_190 = (HlslParseContext *)
                    TIntermediate::setAggregateOperator
                              ((this->super_TParseContextBase).super_TParseVersions.intermediate,
                               (TIntermNode *)local_190,EOpConstructStruct,type,loc);
      }
      this_local = local_190;
    }
    else {
      iVar3 = (*(this_00->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x32])();
      p._M_current._4_4_ = 0;
      local_1b0._M_current =
           (TIntermNode **)
           std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::begin
                     ((vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> *)
                      CONCAT44(extraout_var_04,iVar3));
      while( true ) {
        local_1b8._M_current =
             (TIntermNode **)
             std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::end
                       ((vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> *)
                        CONCAT44(extraout_var_04,iVar3));
        bVar11 = __gnu_cxx::operator!=(&local_1b0,&local_1b8);
        if (!bVar11) break;
        uVar4 = (*type->_vptr_TType[0x1d])();
        TVar5 = memberTypes._M_current._4_4_;
        if ((uVar4 & 1) == 0) {
          if (memberTypes._M_current._4_4_ == EOpConstructStruct) {
            ppTVar10 = __gnu_cxx::
                       __normal_iterator<TIntermNode_**,_std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>_>
                       ::operator*(&local_1b0);
            pTVar2 = *ppTVar10;
            pTVar8 = __gnu_cxx::
                     __normal_iterator<const_glslang::TTypeLoc_*,_std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>_>
                     ::operator[](&local_48,(long)p._M_current._4_4_);
            pTVar1 = pTVar8->type;
            iVar6 = p._M_current._4_4_ + 1;
            iVar7 = (**(node->super_TIntermNode)._vptr_TIntermNode)();
            local_190 = (HlslParseContext *)
                        constructAggregate(this,pTVar2,pTVar1,iVar6,
                                           (TSourceLoc *)CONCAT44(extraout_var_06,iVar7));
          }
          else {
            ppTVar10 = __gnu_cxx::
                       __normal_iterator<TIntermNode_**,_std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>_>
                       ::operator*(&local_1b0);
            iVar6 = (*(*ppTVar10)->_vptr_TIntermNode[3])();
            iVar7 = (**(node->super_TIntermNode)._vptr_TIntermNode)();
            local_190 = (HlslParseContext *)
                        constructBuiltIn(this,type,TVar5,
                                         (TIntermTyped *)CONCAT44(extraout_var_07,iVar6),
                                         (TSourceLoc *)CONCAT44(extraout_var_08,iVar7),true);
          }
        }
        else {
          ppTVar10 = __gnu_cxx::
                     __normal_iterator<TIntermNode_**,_std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>_>
                     ::operator*(&local_1b0);
          pTVar2 = *ppTVar10;
          iVar6 = p._M_current._4_4_ + 1;
          iVar7 = (**(node->super_TIntermNode)._vptr_TIntermNode)();
          local_190 = (HlslParseContext *)
                      constructAggregate(this,pTVar2,(TType *)&dereferenced.spirvType,iVar6,
                                         (TSourceLoc *)CONCAT44(extraout_var_05,iVar7));
        }
        if (local_190 == (HlslParseContext *)0x0) {
          this_local = (HlslParseContext *)0x0;
          goto LAB_0062c740;
        }
        ppTVar10 = __gnu_cxx::
                   __normal_iterator<TIntermNode_**,_std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>_>
                   ::operator*(&local_1b0);
        *ppTVar10 = (TIntermNode *)local_190;
        __gnu_cxx::
        __normal_iterator<TIntermNode_**,_std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>_>
        ::operator++(&local_1b0,0);
        p._M_current._4_4_ = p._M_current._4_4_ + 1;
      }
      this_local = (HlslParseContext *)
                   TIntermediate::setAggregateOperator
                             ((this->super_TParseContextBase).super_TParseVersions.intermediate,
                              (TIntermNode *)this_00,memberTypes._M_current._4_4_,type,loc);
    }
LAB_0062c740:
    TType::~TType((TType *)&dereferenced.spirvType);
  }
  return (TIntermTyped *)this_local;
}

Assistant:

TIntermTyped* HlslParseContext::addConstructor(const TSourceLoc& loc, TIntermTyped* node, const TType& type)
{
    TIntermAggregate* aggrNode = node->getAsAggregate();
    TOperator op = intermediate.mapTypeToConstructorOp(type);

    if (op == EOpConstructTextureSampler)
        return intermediate.setAggregateOperator(aggrNode, op, type, loc);

    TTypeList::const_iterator memberTypes;
    if (op == EOpConstructStruct)
        memberTypes = type.getStruct()->begin();

    TType elementType;
    if (type.isArray()) {
        TType dereferenced(type, 0);
        elementType.shallowCopy(dereferenced);
    } else
        elementType.shallowCopy(type);

    bool singleArg;
    if (aggrNode != nullptr) {
        if (aggrNode->getOp() != EOpNull)
            singleArg = true;
        else
            singleArg = false;
    } else
        singleArg = true;

    TIntermTyped *newNode;
    if (singleArg) {
        // Handle array -> array conversion
        // Constructing an array of one type from an array of another type is allowed,
        // assuming there are enough components available (semantic-checked earlier).
        if (type.isArray() && node->isArray())
            newNode = convertArray(node, type);

        // If structure constructor or array constructor is being called
        // for only one parameter inside the aggregate, we need to call constructAggregate function once.
        else if (type.isArray())
            newNode = constructAggregate(node, elementType, 1, node->getLoc());
        else if (op == EOpConstructStruct)
            newNode = constructAggregate(node, *(*memberTypes).type, 1, node->getLoc());
        else {
            // shape conversion for matrix constructor from scalar.  HLSL semantics are: scalar
            // is replicated into every element of the matrix (not just the diagnonal), so
            // that is handled specially here.
            if (type.isMatrix() && node->getType().isScalarOrVec1())
                node = intermediate.addShapeConversion(type, node);

            newNode = constructBuiltIn(type, op, node, node->getLoc(), false);
        }

        if (newNode && (type.isArray() || op == EOpConstructStruct))
            newNode = intermediate.setAggregateOperator(newNode, EOpConstructStruct, type, loc);

        return newNode;
    }

    //
    // Handle list of arguments.
    //
    TIntermSequence& sequenceVector = aggrNode->getSequence();    // Stores the information about the parameter to the constructor
    // if the structure constructor contains more than one parameter, then construct
    // each parameter

    int paramCount = 0;  // keeps a track of the constructor parameter number being checked

    // for each parameter to the constructor call, check to see if the right type is passed or convert them
    // to the right type if possible (and allowed).
    // for structure constructors, just check if the right type is passed, no conversion is allowed.

    for (TIntermSequence::iterator p = sequenceVector.begin();
        p != sequenceVector.end(); p++, paramCount++) {
        if (type.isArray())
            newNode = constructAggregate(*p, elementType, paramCount + 1, node->getLoc());
        else if (op == EOpConstructStruct)
            newNode = constructAggregate(*p, *(memberTypes[paramCount]).type, paramCount + 1, node->getLoc());
        else
            newNode = constructBuiltIn(type, op, (*p)->getAsTyped(), node->getLoc(), true);

        if (newNode)
            *p = newNode;
        else
            return nullptr;
    }

    TIntermTyped* constructor = intermediate.setAggregateOperator(aggrNode, op, type, loc);

    return constructor;
}